

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O3

Lexeme * BinaryCache::GetLexems(char *path,uint *count)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  
  uVar1 = NULLC::GetStringHash(path);
  if ((ulong)DAT_0022727c != 0) {
    puVar2 = (uint *)(cache + 0x20);
    uVar3 = 0;
    do {
      if (uVar1 == puVar2[-6]) {
        *count = *puVar2;
        if (DAT_0022727c <= (uint)uVar3) {
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x7f,
                        "T &FastVector<BinaryCache::CodeDescriptor>::operator[](unsigned int) [T = BinaryCache::CodeDescriptor, zeroNewMemory = false, skipConstructor = false]"
                       );
        }
        return *(Lexeme **)(puVar2 + -2);
      }
      uVar3 = uVar3 + 1;
      puVar2 = puVar2 + 10;
    } while (DAT_0022727c != uVar3);
  }
  return (Lexeme *)0x0;
}

Assistant:

Lexeme* BinaryCache::GetLexems(const char* path, unsigned& count)
{
	unsigned int hash = NULLC::GetStringHash(path);
	for(unsigned int i = 0; i < cache.size(); i++)
	{
		if(hash == cache[i].nameHash)
		{
			count = cache[i].lexemeCount;
			return cache[i].lexemes;
		}
	}
	return NULL;
}